

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
          (TiledRgbaOutputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  size_t in_RCX;
  size_t in_RDX;
  Rgba *in_RSI;
  long in_RDI;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  lock_guard<std::mutex> lock;
  FrameBuffer *in_stack_000003d8;
  TiledOutputFile *in_stack_000003e0;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Slice local_158;
  Slice local_120;
  Slice local_e8;
  Slice local_a0;
  size_t local_38;
  size_t local_30;
  size_t local_20;
  size_t local_18;
  Rgba *local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_30 = in_RDX << 3;
    local_38 = in_RCX << 3;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x24bdce);
    Slice::Slice(&local_a0,HALF,(char *)local_10,local_30,local_38,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)ys,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    Slice::Slice(&local_e8,HALF,(char *)&local_10->g,local_30,local_38,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)ys,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    Slice::Slice(&local_120,HALF,(char *)&local_10->b,local_30,local_38,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)ys,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    Slice::Slice(&local_158,HALF,(char *)&local_10->a,local_30,local_38,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)ys,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TiledOutputFile::setFrameBuffer(in_stack_000003e0,in_stack_000003d8);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x24bf93);
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ToYa::setFrameBuffer(*(ToYa **)(in_RDI + 0x10),local_10,local_18,local_20);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24bd94);
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::setFrameBuffer (
    const Rgba* base, size_t xStride, size_t yStride)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        _toYa->setFrameBuffer (base, xStride, yStride);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        fb.insert ("R", Slice (HALF, (char*) &base[0].r, xs, ys));
        fb.insert ("G", Slice (HALF, (char*) &base[0].g, xs, ys));
        fb.insert ("B", Slice (HALF, (char*) &base[0].b, xs, ys));
        fb.insert ("A", Slice (HALF, (char*) &base[0].a, xs, ys));

        _outputFile->setFrameBuffer (fb);
    }
}